

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_check_small_factors(mbedtls_mpi *X)

{
  int iVar1;
  mbedtls_mpi_uint local_30;
  mbedtls_mpi_uint r;
  size_t i;
  mbedtls_mpi *pmStack_18;
  int ret;
  mbedtls_mpi *X_local;
  
  i._4_4_ = 0;
  if ((*X->p & 1) == 0) {
    X_local._4_4_ = -0xe;
  }
  else {
    pmStack_18 = X;
    for (r = 0; 0 < small_prime[r]; r = r + 1) {
      iVar1 = mbedtls_mpi_cmp_int(pmStack_18,(long)small_prime[r]);
      if (iVar1 < 1) {
        return 1;
      }
      i._4_4_ = mbedtls_mpi_mod_int(&local_30,pmStack_18,(long)small_prime[r]);
      if (i._4_4_ != 0) break;
      if (local_30 == 0) {
        return -0xe;
      }
    }
    X_local._4_4_ = i._4_4_;
  }
  return X_local._4_4_;
}

Assistant:

static int mpi_check_small_factors( const mbedtls_mpi *X )
{
    int ret = 0;
    size_t i;
    mbedtls_mpi_uint r;

    if( ( X->p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );

    for( i = 0; small_prime[i] > 0; i++ )
    {
        if( mbedtls_mpi_cmp_int( X, small_prime[i] ) <= 0 )
            return( 1 );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_int( &r, X, small_prime[i] ) );

        if( r == 0 )
            return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );
    }

cleanup:
    return( ret );
}